

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Array<kj::ReadableDirectory::Entry> * __thiscall
kj::anon_unknown_59::InMemoryDirectory::listEntries
          (Array<kj::ReadableDirectory::Entry> *__return_storage_ptr__,InMemoryDirectory *this)

{
  int iVar1;
  size_t capacity;
  Type TVar2;
  Entry *pEVar3;
  _Base_ptr p_Var4;
  Entry *pEVar5;
  Array<kj::ReadableDirectory::Entry> *result;
  _Rb_tree_header *p_Var6;
  DebugExpression<bool> _kjCondition;
  DebugExpression<bool> local_81;
  Mutex *local_80;
  Fault local_78;
  Entry *local_70;
  Entry *local_68;
  Entry *local_60;
  undefined8 *local_58;
  Type local_50;
  String local_48;
  
  local_80 = &(this->impl).mutex;
  local_70 = (Entry *)((ulong)local_70 & 0xffffffffffffff00);
  kj::_::Mutex::lock();
  capacity = (this->impl).value.entries._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pEVar3 = (Entry *)kj::_::HeapArrayDisposer::allocateImpl
                              (0x20,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0
                              );
  local_60 = pEVar3 + capacity;
  local_58 = &kj::_::HeapArrayDisposer::instance;
  p_Var4 = *(_Base_ptr *)
            ((long)&(this->impl).value.entries._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  p_Var6 = &(this->impl).value.entries._M_t._M_impl.super__Rb_tree_header;
  pEVar5 = pEVar3;
  local_70 = pEVar3;
  local_68 = pEVar3;
  if ((_Rb_tree_header *)p_Var4 != p_Var6) {
    do {
      iVar1 = *(int *)&p_Var4[2]._M_parent;
      if (iVar1 == 1) {
        TVar2 = FILE;
      }
      else {
        TVar2 = SYMLINK;
        if (iVar1 != 3) {
          local_81.value = iVar1 == 2;
          if (!local_81.value) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                      (&local_78,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                       ,0x3ff,FAILED,"e.second.node.is<DirectoryNode>()","_kjCondition,",&local_81);
            kj::_::Debug::Fault::fatal(&local_78);
          }
          TVar2 = DIRECTORY;
        }
      }
      local_50 = TVar2;
      heapString(&local_48,*(char **)(p_Var4 + 1),
                 (size_t)((long)&p_Var4[1]._M_parent[-1]._M_right + 7));
      pEVar5->type = local_50;
      (pEVar5->name).content.ptr = local_48.content.ptr;
      (pEVar5->name).content.size_ = local_48.content.size_;
      (pEVar5->name).content.disposer = local_48.content.disposer;
      pEVar5 = pEVar5 + 1;
      local_68 = pEVar5;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var6);
  }
  __return_storage_ptr__->ptr = pEVar3;
  __return_storage_ptr__->size_ = (long)pEVar5 - (long)pEVar3 >> 5;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  kj::_::Mutex::unlock(local_80,SHARED,(Waiter *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Array<Entry> listEntries() const override {
    auto lock = impl.lockShared();
    return KJ_MAP(e, lock->entries) {
      FsNode::Type type;
      if (e.second.node.is<SymlinkNode>()) {
        type = FsNode::Type::SYMLINK;
      } else if (e.second.node.is<FileNode>()) {
        type = FsNode::Type::FILE;
      } else {
        KJ_ASSERT(e.second.node.is<DirectoryNode>());
        type = FsNode::Type::DIRECTORY;
      }

      return Entry { type, heapString(e.first) };
    };
  }